

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::indent(raw_ostream *this,uint NumSpaces)

{
  raw_ostream *prVar1;
  uint NumSpaces_local;
  raw_ostream *this_local;
  
  prVar1 = write_padding<(char)32>(this,NumSpaces);
  return prVar1;
}

Assistant:

raw_ostream &raw_ostream::indent(unsigned NumSpaces) {
  return write_padding<' '>(*this, NumSpaces);
}